

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::Reporter::fatal_usage<char_const(&)[62],char_const*&>
          (Reporter *this,char (*args) [62],char **args_1)

{
  size_t sVar1;
  undefined8 uVar2;
  undefined8 in_RSI;
  ReturnCode in_stack_fffffffffffffefc;
  FatalError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  ostream *in_stack_ffffffffffffff30;
  basic_string_view<char> in_stack_ffffffffffffff38;
  undefined8 local_b0;
  size_t local_a8;
  char *local_a0 [3];
  undefined8 local_88;
  char *local_78;
  FatalError *local_70;
  char *local_68;
  FatalError *local_60;
  char *local_58;
  char *local_50;
  undefined1 *local_48;
  char *local_40;
  undefined1 *local_38;
  char *local_30;
  undefined8 local_28;
  undefined8 *local_20;
  undefined8 local_18;
  undefined8 *local_10;
  undefined8 local_8;
  
  this_00 = (FatalError *)local_a0;
  local_78 = "{} fatal: ";
  local_68 = "{} fatal: ";
  local_a0[0] = "{} fatal: ";
  local_88 = in_RSI;
  local_70 = this_00;
  local_60 = this_00;
  sVar1 = std::char_traits<char>::length((char_type *)0x23170a);
  *(size_t *)&this_00->returnCode = sVar1;
  local_58 = local_78;
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff30,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff28);
  local_20 = &local_b0;
  local_28 = local_88;
  local_18 = local_88;
  local_b0 = local_88;
  local_10 = local_20;
  local_a8 = std::char_traits<char>::length((char_type *)0x2317a8);
  local_8 = local_28;
  ::fmt::v10::print<char_const*&>
            (in_stack_ffffffffffffff30,(format_string<const_char_*&>)in_stack_ffffffffffffff38,
             (char **)in_stack_ffffffffffffff28);
  local_48 = &stack0xffffffffffffff40;
  local_50 = " See \'{} --help\'.\n";
  local_40 = " See \'{} --help\'.\n";
  local_38 = local_48;
  std::char_traits<char>::length((char_type *)0x23183e);
  local_30 = local_50;
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff30,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff28);
  uVar2 = __cxa_allocate_exception(0x10);
  FatalError::FatalError(this_00,in_stack_fffffffffffffefc);
  __cxa_throw(uVar2,&FatalError::typeinfo,FatalError::~FatalError);
}

Assistant:

void fatal_usage(Args&&... args) {
        fmt::print(std::cerr, "{} fatal: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, " See '{} --help'.\n", commandName);
        throw FatalError(rc::INVALID_ARGUMENTS);
    }